

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_6_3_True(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int i;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  float *pfVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  float *pfVar42;
  float *pfVar43;
  int iVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [12];
  undefined1 auVar78 [64];
  float fVar80;
  undefined1 auVar81 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar85 [64];
  
  auVar53._8_4_ = 0x3effffff;
  auVar53._0_8_ = 0x3effffff3effffff;
  auVar53._12_4_ = 0x3effffff;
  auVar81 = ZEXT1664(auVar53);
  auVar52._8_4_ = 0x80000000;
  auVar52._0_8_ = 0x8000000080000000;
  auVar52._12_4_ = 0x80000000;
  fVar59 = ipoint->scale;
  auVar85 = ZEXT464((uint)fVar59);
  auVar49 = ZEXT816(0x3fe0000000000000);
  auVar78 = ZEXT1664(auVar49);
  auVar54 = ZEXT416((uint)fVar59);
  auVar45 = vpternlogd_avx512vl(auVar53,auVar54,auVar52,0xf8);
  auVar45 = ZEXT416((uint)(fVar59 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  fVar57 = -0.08 / (fVar59 * fVar59);
  iVar31 = (int)auVar45._0_4_;
  auVar46._0_4_ = (int)auVar45._0_4_;
  auVar46._4_4_ = (int)auVar45._4_4_;
  auVar46._8_4_ = (int)auVar45._8_4_;
  auVar46._12_4_ = (int)auVar45._12_4_;
  auVar45 = vcvtdq2ps_avx(auVar46);
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->x),auVar52,0xf8);
  auVar46 = ZEXT416((uint)(ipoint->x + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47._0_8_ = (double)auVar46._0_4_;
  auVar47._8_8_ = auVar46._8_8_;
  auVar51._0_8_ = (double)fVar59;
  auVar51._8_8_ = 0;
  auVar46 = vfmadd231sd_fma(auVar47,auVar51,auVar49);
  auVar50._0_4_ = (float)auVar46._0_8_;
  auVar50._4_12_ = auVar46._4_12_;
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->y),auVar52,0xf8);
  fVar3 = auVar50._0_4_ - auVar45._0_4_;
  auVar46 = ZEXT416((uint)(ipoint->y + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar48._0_8_ = (double)auVar46._0_4_;
  auVar48._8_8_ = auVar46._8_8_;
  auVar46 = vfmadd231sd_fma(auVar48,auVar51,auVar49);
  auVar49._0_4_ = (float)auVar46._0_8_;
  auVar49._4_12_ = auVar46._4_12_;
  fVar84 = auVar49._0_4_ - auVar45._0_4_;
  auVar47 = ZEXT416((uint)fVar59);
  auVar45 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar47,auVar50);
  auVar46 = vpternlogd_avx512vl(auVar53,auVar45,auVar52,0xf8);
  auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  if (iVar31 < (int)auVar45._0_4_) {
    auVar55._8_4_ = 0x3effffff;
    auVar55._0_8_ = 0x3effffff3effffff;
    auVar55._12_4_ = 0x3effffff;
    auVar56._8_4_ = 0x80000000;
    auVar56._0_8_ = 0x8000000080000000;
    auVar56._12_4_ = 0x80000000;
    auVar45 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar47,auVar49);
    auVar46 = vpternlogd_avx512vl(auVar56,auVar45,auVar55,0xea);
    auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
    auVar45 = vroundss_avx(auVar45,auVar45,0xb);
    if (iVar31 < (int)auVar45._0_4_) {
      auVar45 = vfmadd231ss_fma(auVar50,auVar47,ZEXT416(0x41300000));
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar46 = vpternlogd_avx512vl(auVar76,auVar45,auVar55,0xea);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
      auVar45 = vroundss_avx(auVar45,auVar45,0xb);
      if ((int)auVar45._0_4_ + iVar31 <= iimage->width) {
        auVar45 = vfmadd231ss_fma(auVar49,auVar47,ZEXT416(0x41300000));
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar46 = vpternlogd_avx512vl(auVar55,auVar45,auVar12,0xf8);
        auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
        auVar45 = vroundss_avx(auVar45,auVar45,0xb);
        if ((int)auVar45._0_4_ + iVar31 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          fVar84 = fVar84 + 0.5;
          lVar39 = 0x120;
          for (uVar28 = 0xfffffff4; (int)uVar28 < 0xc; uVar28 = uVar28 + 6) {
            auVar45._0_4_ = (float)(int)uVar28;
            auVar79 = in_ZMM8._4_12_;
            auVar45._4_12_ = auVar79;
            auVar47 = auVar85._0_16_;
            auVar45 = vfmadd213ss_fma(auVar45,auVar47,ZEXT416((uint)fVar84));
            iVar21 = (int)auVar45._0_4_;
            auVar61._0_4_ = (float)(int)(uVar28 | 1);
            auVar61._4_12_ = auVar79;
            auVar45 = vfmadd213ss_fma(auVar61,auVar47,ZEXT416((uint)fVar84));
            iVar22 = (int)auVar45._0_4_;
            auVar62._0_4_ = (float)(int)(uVar28 + 2);
            auVar62._4_12_ = auVar79;
            auVar46 = ZEXT416((uint)fVar84);
            auVar45 = vfmadd213ss_fma(auVar62,auVar47,auVar46);
            iVar23 = (int)auVar45._0_4_;
            auVar63._0_4_ = (float)(int)(uVar28 + 3);
            auVar63._4_12_ = auVar79;
            auVar45 = vfmadd213ss_fma(auVar63,auVar47,auVar46);
            iVar24 = (int)auVar45._0_4_;
            auVar64._0_4_ = (float)(int)(uVar28 + 4);
            auVar64._4_12_ = auVar79;
            auVar45 = vfmadd213ss_fma(auVar64,auVar47,auVar46);
            iVar20 = (int)auVar45._0_4_;
            auVar65._0_4_ = (float)(int)(uVar28 + 5);
            auVar65._4_12_ = auVar79;
            auVar45 = vfmadd213ss_fma(auVar65,auVar47,auVar46);
            iVar19 = (int)auVar45._0_4_;
            lVar40 = lVar39;
            for (iVar27 = -0xc; iVar27 < 0xc; iVar27 = iVar27 + 3) {
              auVar66._0_4_ = (float)iVar27;
              auVar79 = auVar78._4_12_;
              auVar66._4_12_ = auVar79;
              auVar45 = vfmadd213ss_fma(auVar66,auVar54,ZEXT416((uint)fVar3));
              iVar44 = (int)auVar45._0_4_;
              auVar67._0_4_ = (float)(iVar27 + 1);
              auVar67._4_12_ = auVar79;
              auVar45 = vfmadd213ss_fma(auVar67,auVar54,ZEXT416((uint)fVar3));
              iVar25 = (int)auVar45._0_4_;
              auVar68._0_4_ = (float)(iVar27 + 2);
              auVar68._4_12_ = auVar79;
              auVar45 = vfmadd213ss_fma(auVar68,auVar54,ZEXT416((uint)fVar3));
              iVar26 = (int)auVar45._0_4_;
              haarXY_unconditional
                        (iimage,iVar21,iVar44,iVar31,
                         (float *)((long)haarResponseX + lVar40 + -0x120),
                         (float *)((long)haarResponseY + lVar40 + -0x120));
              haarXY_unconditional
                        (iimage,iVar22,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + -0xc0)
                         ,(float *)((long)haarResponseY + lVar40 + -0xc0));
              haarXY_unconditional
                        (iimage,iVar23,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + -0x60)
                         ,(float *)((long)haarResponseY + lVar40 + -0x60));
              haarXY_unconditional
                        (iimage,iVar24,iVar44,iVar31,(float *)((long)haarResponseX + lVar40),
                         (float *)((long)haarResponseY + lVar40));
              haarXY_unconditional
                        (iimage,iVar20,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + 0x60),
                         (float *)((long)haarResponseY + lVar40 + 0x60));
              haarXY_unconditional
                        (iimage,iVar19,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + 0xc0),
                         (float *)((long)haarResponseY + lVar40 + 0xc0));
              haarXY_unconditional
                        (iimage,iVar21,iVar25,iVar31,
                         (float *)((long)haarResponseX + lVar40 + -0x11c),
                         (float *)((long)haarResponseY + lVar40 + -0x11c));
              haarXY_unconditional
                        (iimage,iVar22,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + -0xbc)
                         ,(float *)((long)haarResponseY + lVar40 + -0xbc));
              haarXY_unconditional
                        (iimage,iVar23,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + -0x5c)
                         ,(float *)((long)haarResponseY + lVar40 + -0x5c));
              haarXY_unconditional
                        (iimage,iVar24,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + 4),
                         (float *)((long)haarResponseY + lVar40 + 4));
              haarXY_unconditional
                        (iimage,iVar20,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + 100),
                         (float *)((long)haarResponseY + lVar40 + 100));
              haarXY_unconditional
                        (iimage,iVar19,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + 0xc4),
                         (float *)((long)haarResponseY + lVar40 + 0xc4));
              haarXY_unconditional
                        (iimage,iVar21,iVar26,iVar31,
                         (float *)((long)haarResponseX + lVar40 + -0x118),
                         (float *)((long)haarResponseY + lVar40 + -0x118));
              haarXY_unconditional
                        (iimage,iVar22,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + -0xb8)
                         ,(float *)((long)haarResponseY + lVar40 + -0xb8));
              haarXY_unconditional
                        (iimage,iVar23,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + -0x58)
                         ,(float *)((long)haarResponseY + lVar40 + -0x58));
              haarXY_unconditional
                        (iimage,iVar24,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + 8),
                         (float *)((long)haarResponseY + lVar40 + 8));
              haarXY_unconditional
                        (iimage,iVar20,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + 0x68),
                         (float *)((long)haarResponseY + lVar40 + 0x68));
              haarXY_unconditional
                        (iimage,iVar19,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + 200),
                         (float *)((long)haarResponseY + lVar40 + 200));
              lVar40 = lVar40 + 0xc;
            }
            auVar85 = ZEXT1664(auVar54);
            lVar39 = lVar39 + 0x240;
          }
          goto LAB_001a639e;
        }
      }
    }
  }
  lVar39 = 0x120;
  for (uVar28 = 0xfffffff4; (int)uVar28 < 0xc; uVar28 = uVar28 + 6) {
    auVar45 = vpbroadcastd_avx512vl();
    auVar70._0_4_ = (float)(int)uVar28;
    auVar70._4_12_ = in_ZMM8._4_12_;
    auVar45 = vpaddd_avx(auVar45,_DAT_002716a0);
    auVar46 = vfmadd213ss_fma(auVar70,auVar85._0_16_,ZEXT416((uint)fVar84));
    auVar74._0_4_ = (float)(int)(uVar28 | 1);
    auVar74._4_12_ = in_ZMM8._4_12_;
    fVar58 = auVar46._0_4_;
    auVar46 = vfmadd213ss_fma(auVar74,auVar85._0_16_,ZEXT416((uint)fVar84));
    fVar69 = auVar46._0_4_;
    iVar19 = (int)((double)((ulong)(0.0 <= fVar58) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar58) * -0x4020000000000000) + (double)fVar58);
    auVar45 = vcvtdq2ps_avx(auVar45);
    iVar20 = (int)((double)((ulong)(0.0 <= fVar69) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar69) * -0x4020000000000000) + (double)fVar69);
    auVar17._4_4_ = fVar84;
    auVar17._0_4_ = fVar84;
    auVar17._8_4_ = fVar84;
    auVar17._12_4_ = fVar84;
    auVar18._4_4_ = fVar59;
    auVar18._0_4_ = fVar59;
    auVar18._8_4_ = fVar59;
    auVar18._12_4_ = fVar59;
    auVar46 = vfmadd132ps_fma(auVar45,auVar17,auVar18);
    uVar30 = vcmpps_avx512vl(auVar46,_DAT_002711c0,0xd);
    auVar45 = vshufps_avx(auVar46,auVar46,0xff);
    bVar14 = (byte)(uVar30 >> 3);
    bVar15 = (byte)(uVar30 >> 2);
    bVar16 = (byte)(uVar30 >> 1);
    iVar21 = (int)((double)((ulong)(bVar14 & 1) * 0x3fe0000000000000 +
                           (ulong)!(bool)(bVar14 & 1) * -0x4020000000000000) + (double)auVar45._0_4_
                  );
    auVar45 = vshufpd_avx(auVar46,auVar46,1);
    iVar22 = (int)((double)((ulong)(bVar15 & 1) * 0x3fe0000000000000 +
                           (ulong)!(bool)(bVar15 & 1) * -0x4020000000000000) + (double)auVar45._0_4_
                  );
    auVar45 = vmovshdup_avx(auVar46);
    iVar23 = (int)((double)((ulong)(bVar16 & 1) * 0x3fe0000000000000 +
                           (ulong)!(bool)(bVar16 & 1) * -0x4020000000000000) + (double)auVar45._0_4_
                  );
    iVar24 = (int)((double)((ulong)((byte)uVar30 & 1) * 0x3fe0000000000000 +
                           (ulong)!(bool)((byte)uVar30 & 1) * -0x4020000000000000) +
                  (double)auVar46._0_4_);
    lVar40 = lVar39;
    for (iVar27 = -0xc; iVar27 < 0xc; iVar27 = iVar27 + 3) {
      auVar60._0_4_ = (float)iVar27;
      auVar79 = auVar81._4_12_;
      auVar60._4_12_ = auVar79;
      auVar45 = vfmadd213ss_fma(auVar60,auVar54,ZEXT416((uint)fVar3));
      auVar71._0_4_ = (float)(iVar27 + 1);
      auVar71._4_12_ = auVar79;
      auVar46 = vfmadd213ss_fma(auVar71,auVar54,ZEXT416((uint)fVar3));
      auVar75._0_4_ = (float)(iVar27 + 2);
      auVar75._4_12_ = auVar79;
      auVar47 = vfmadd213ss_fma(auVar75,auVar54,ZEXT416((uint)fVar3));
      fVar58 = auVar45._0_4_;
      fVar69 = auVar46._0_4_;
      fVar72 = auVar47._0_4_;
      iVar44 = (int)((double)((ulong)(0.0 <= fVar58) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar58) * -0x4020000000000000) + (double)fVar58);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar69) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar69) * -0x4020000000000000) + (double)fVar69);
      iVar26 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
      haarXY_precheck_boundaries
                (iimage,iVar19,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + -0x120),
                 (float *)((long)haarResponseY + lVar40 + -0x120));
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + -0xc0),
                 (float *)((long)haarResponseY + lVar40 + -0xc0));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + -0x60),
                 (float *)((long)haarResponseY + lVar40 + -0x60));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar44,iVar31,(float *)((long)haarResponseX + lVar40),
                 (float *)((long)haarResponseY + lVar40));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + 0x60),
                 (float *)((long)haarResponseY + lVar40 + 0x60));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar44,iVar31,(float *)((long)haarResponseX + lVar40 + 0xc0),
                 (float *)((long)haarResponseY + lVar40 + 0xc0));
      haarXY_precheck_boundaries
                (iimage,iVar19,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + -0x11c),
                 (float *)((long)haarResponseY + lVar40 + -0x11c));
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + -0xbc),
                 (float *)((long)haarResponseY + lVar40 + -0xbc));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + -0x5c),
                 (float *)((long)haarResponseY + lVar40 + -0x5c));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + 4),
                 (float *)((long)haarResponseY + lVar40 + 4));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + 100),
                 (float *)((long)haarResponseY + lVar40 + 100));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar25,iVar31,(float *)((long)haarResponseX + lVar40 + 0xc4),
                 (float *)((long)haarResponseY + lVar40 + 0xc4));
      haarXY_precheck_boundaries
                (iimage,iVar19,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + -0x118),
                 (float *)((long)haarResponseY + lVar40 + -0x118));
      haarXY_precheck_boundaries
                (iimage,iVar20,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + -0xb8),
                 (float *)((long)haarResponseY + lVar40 + -0xb8));
      haarXY_precheck_boundaries
                (iimage,iVar21,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + -0x58),
                 (float *)((long)haarResponseY + lVar40 + -0x58));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + 8),
                 (float *)((long)haarResponseY + lVar40 + 8));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + 0x68),
                 (float *)((long)haarResponseY + lVar40 + 0x68));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar26,iVar31,(float *)((long)haarResponseX + lVar40 + 200),
                 (float *)((long)haarResponseY + lVar40 + 200));
      lVar40 = lVar40 + 0xc;
    }
    auVar85 = ZEXT1664(auVar54);
    lVar39 = lVar39 + 0x240;
  }
LAB_001a639e:
  fVar84 = auVar85._0_4_;
  auVar83._8_4_ = 0x3effffff;
  auVar83._0_8_ = 0x3effffff3effffff;
  auVar83._12_4_ = 0x3effffff;
  auVar82._8_4_ = 0x80000000;
  auVar82._0_8_ = 0x8000000080000000;
  auVar82._12_4_ = 0x80000000;
  auVar45 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 0.5)),auVar82,0xf8);
  auVar45 = ZEXT416((uint)(fVar84 * 0.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 1.5)),auVar82,0xf8);
  auVar46 = ZEXT416((uint)(fVar84 * 1.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 2.5)),auVar82,0xf8);
  auVar47 = ZEXT416((uint)(fVar84 * 2.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 3.5)),auVar82,0xf8);
  auVar48 = ZEXT416((uint)(fVar84 * 3.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 4.5)),auVar82,0xf8);
  auVar49 = ZEXT416((uint)(fVar84 * 4.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 5.5)),auVar82,0xf8);
  auVar50 = ZEXT416((uint)(fVar84 * 5.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 6.5)),auVar82,0xf8);
  auVar51 = ZEXT416((uint)(fVar84 * 6.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 7.5)),auVar82,0xf8);
  auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar84 * 7.5));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 8.5)),auVar82,0xf8);
  auVar53 = ZEXT416((uint)(fVar84 * 8.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 9.5)),auVar82,0xf8);
  auVar54 = ZEXT416((uint)(fVar84 * 9.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 10.5)),auVar82,0xf8);
  auVar55 = ZEXT416((uint)(fVar84 * 10.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar84 * 11.5)),auVar82,0xf8);
  fVar73 = auVar47._0_4_;
  fVar59 = fVar73 + auVar46._0_4_;
  fVar3 = fVar73 + auVar45._0_4_;
  auVar47 = ZEXT416((uint)(fVar84 * 11.5 + auVar56._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  fVar84 = fVar73 - auVar45._0_4_;
  fVar58 = fVar73 - auVar46._0_4_;
  fVar69 = fVar73 - auVar48._0_4_;
  fVar72 = fVar73 - auVar49._0_4_;
  fVar4 = fVar73 - auVar50._0_4_;
  fVar73 = fVar73 - auVar51._0_4_;
  fVar80 = auVar52._0_4_;
  fVar5 = fVar80 - auVar48._0_4_;
  fVar6 = fVar80 - auVar49._0_4_;
  fVar7 = fVar80 - auVar50._0_4_;
  fVar8 = fVar80 - auVar51._0_4_;
  fVar9 = fVar80 - auVar53._0_4_;
  fVar10 = fVar80 - auVar54._0_4_;
  fVar11 = fVar80 - auVar55._0_4_;
  fVar80 = fVar80 - auVar47._0_4_;
  gauss_s1_c0[0] = expf(fVar59 * fVar59 * fVar57);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar57);
  gauss_s1_c0[2] = expf(fVar84 * fVar84 * fVar57);
  gauss_s1_c0[3] = expf(fVar58 * fVar58 * fVar57);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar69 * fVar69 * fVar57);
  gauss_s1_c0[6] = expf(fVar72 * fVar72 * fVar57);
  gauss_s1_c0[7] = expf(fVar4 * fVar4 * fVar57);
  gauss_s1_c0[8] = expf(fVar73 * fVar73 * fVar57);
  gauss_s1_c1[0] = expf(fVar5 * fVar5 * fVar57);
  gauss_s1_c1[1] = expf(fVar6 * fVar6 * fVar57);
  gauss_s1_c1[2] = expf(fVar7 * fVar7 * fVar57);
  gauss_s1_c1[3] = expf(fVar8 * fVar8 * fVar57);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar9 * fVar9 * fVar57);
  gauss_s1_c1[6] = expf(fVar10 * fVar10 * fVar57);
  gauss_s1_c1[7] = expf(fVar11 * fVar11 * fVar57);
  gauss_s1_c1[8] = expf(fVar80 * fVar80 * fVar57);
  auVar78 = ZEXT1264(ZEXT812(0));
  lVar39 = 0;
  auVar54._8_4_ = 0x7fffffff;
  auVar54._0_8_ = 0x7fffffff7fffffff;
  auVar54._12_4_ = 0x7fffffff;
  iVar31 = 0;
  lVar40 = 0;
  uVar30 = 0xfffffffffffffff8;
  while (uVar28 = (uint)uVar30, (int)uVar28 < 8) {
    pfVar42 = gauss_s1_c1;
    if (uVar28 != 7) {
      pfVar42 = gauss_s1_c0;
    }
    lVar41 = (long)iVar31;
    lVar40 = (long)(int)lVar40;
    iVar31 = iVar31 + 4;
    if (uVar28 == 0xfffffff8) {
      pfVar42 = gauss_s1_c1;
    }
    uVar32 = 0;
    uVar37 = 0xfffffffffffffff8;
    lVar33 = lVar39;
    while (lVar41 != iVar31) {
      pfVar43 = gauss_s1_c1;
      iVar27 = (int)uVar37;
      if (iVar27 != 7) {
        pfVar43 = gauss_s1_c0;
      }
      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar37 = (ulong)((uint)(uVar37 >> 0x1c) & 8);
      if (iVar27 == -8) {
        pfVar43 = gauss_s1_c1;
      }
      lVar34 = (long)haarResponseX + lVar33;
      lVar35 = (long)haarResponseY + lVar33;
      for (uVar29 = uVar32; uVar29 < iVar27 * 0x18 + 0x198; uVar29 = uVar29 + 0x18) {
        lVar36 = 0;
        pfVar38 = (float *)((long)pfVar42 + (ulong)(((uint)(uVar30 >> 0x1f) & 1) << 5));
        while (lVar36 != 9) {
          fVar59 = *pfVar38;
          pfVar38 = pfVar38 + (ulong)(~uVar28 >> 0x1f) * 2 + -1;
          lVar1 = lVar36 * 4;
          lVar2 = lVar36 * 4;
          lVar36 = lVar36 + 1;
          auVar47 = ZEXT416((uint)(pfVar43[uVar37] * fVar59 * *(float *)(lVar34 + lVar2)));
          auVar45 = vandps_avx(auVar47,auVar54);
          auVar48 = ZEXT416((uint)(pfVar43[uVar37] * fVar59 * *(float *)(lVar35 + lVar1)));
          auVar46 = vandps_avx(auVar48,auVar54);
          auVar47 = vinsertps_avx(auVar48,auVar47,0x10);
          auVar46 = vmovlhps_avx(auVar47,auVar46);
          auVar45 = vinsertps_avx(auVar46,auVar45,0x30);
          auVar81 = ZEXT1664(CONCAT412(auVar81._12_4_ + auVar45._12_4_,
                                       CONCAT48(auVar81._8_4_ + auVar45._8_4_,
                                                CONCAT44(auVar81._4_4_ + auVar45._4_4_,
                                                         auVar81._0_4_ + auVar45._0_4_))));
        }
        uVar37 = uVar37 + (ulong)(-1 < iVar27) * 2 + -1;
        lVar34 = lVar34 + 0x60;
        lVar35 = lVar35 + 0x60;
      }
      uVar37 = (ulong)(iVar27 + 5);
      uVar32 = uVar32 + 0x78;
      lVar33 = lVar33 + 0x1e0;
      fVar59 = gauss_s2_arr[lVar41];
      auVar13._4_4_ = fVar59;
      auVar13._0_4_ = fVar59;
      auVar13._8_4_ = fVar59;
      auVar13._12_4_ = fVar59;
      auVar48 = vmulps_avx512vl(auVar81._0_16_,auVar13);
      lVar41 = lVar41 + 1;
      auVar77._0_4_ = auVar48._0_4_ * auVar48._0_4_;
      auVar77._4_4_ = auVar48._4_4_ * auVar48._4_4_;
      auVar77._8_4_ = auVar48._8_4_ * auVar48._8_4_;
      auVar77._12_4_ = auVar48._12_4_ * auVar48._12_4_;
      auVar46 = vshufpd_avx(auVar48,auVar48,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar40) = auVar48;
      lVar40 = lVar40 + 4;
      auVar45 = vmovshdup_avx(auVar77);
      auVar47 = vfmadd231ss_fma(auVar45,auVar48,auVar48);
      auVar45 = vshufps_avx(auVar48,auVar48,0xff);
      auVar46 = vfmadd213ss_fma(auVar46,auVar46,auVar47);
      auVar45 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      auVar78 = ZEXT464((uint)(auVar78._0_4_ + auVar45._0_4_));
    }
    lVar39 = lVar39 + 0x14;
    uVar30 = (ulong)(uVar28 + 5);
  }
  if (auVar78._0_4_ < 0.0) {
    fVar59 = sqrtf(auVar78._0_4_);
  }
  else {
    auVar45 = vsqrtss_avx(auVar78._0_16_,auVar78._0_16_);
    fVar59 = auVar45._0_4_;
  }
  for (lVar39 = 0; lVar39 != 0x40; lVar39 = lVar39 + 1) {
    ipoint->descriptor[lVar39] = (1.0 / fVar59) * ipoint->descriptor[lVar39];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_6_3_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            float ipoint_y_sub_int_scale_add_l4_mul_scale = ipoint_y_sub_int_scale + l4 * scale;
            float ipoint_y_sub_int_scale_add_l5_mul_scale = ipoint_y_sub_int_scale + l5 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_l4_mul_scale + (ipoint_y_sub_int_scale_add_l4_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_l5_mul_scale + (ipoint_y_sub_int_scale_add_l5_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_05 + l4 * scale);
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_05 + l5 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}